

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O3

Am_Value __thiscall Am_Value::From_String(Am_Value *this,char *string,Am_ID_Tag type)

{
  Am_Type_Support *pAVar1;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar2;
  Am_Value AVar3;
  
  pAVar1 = Am_Find_Support(type);
  if (pAVar1 == (Am_Type_Support *)0x0) {
    Am_Value(this,&Am_No_Value);
    aVar2 = extraout_RDX_00;
  }
  else {
    (*pAVar1->_vptr_Am_Type_Support[2])(this,pAVar1,string);
    aVar2 = extraout_RDX;
  }
  AVar3.value.wrapper_value = aVar2.wrapper_value;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

Am_Value
Am_Value::From_String(const char *string, Am_ID_Tag type)
{
  const Am_Registered_Type *item = Am_Get_Named_Item(string);
  if (item) {
    if (Am_Type_Class(item->ID()) == Am_WRAPPER) {
      Am_Wrapper *wrapper = (Am_Wrapper *)item;
      wrapper->Note_Reference();
      Am_Value v(wrapper);
      return v;
    } else {
      Am_Value v((Am_Method_Wrapper *)item);
      return v;
    }
  }
  //else not registered by name
  Am_Type_Support *support = Am_Find_Support(type);
  if (support)
    return support->From_String(string);
  return Am_No_Value;
}